

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::RepeatLoopFixedGroupLastIterationInst::Exec
          (RepeatLoopFixedGroupLastIterationInst *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  uint uVar1;
  uint uVar2;
  CharCount CVar3;
  code *pcVar4;
  bool bVar5;
  BeginLoopFixedGroupLastIterationInst *pBVar6;
  LoopInfo *pLVar7;
  Cont *pCVar8;
  undefined4 *puVar9;
  GroupInfo *pGVar10;
  uint8 *puVar11;
  char *pcVar12;
  uint uVar13;
  Label LVar14;
  
  pBVar6 = Matcher::LabelToInstPointer<UnifiedRegex::BeginLoopFixedGroupLastIterationInst>
                     (matcher,BeginLoopFixedGroupLastIteration,
                      (this->super_RepeatLoopMixin).beginLabel);
  pLVar7 = Matcher::LoopIdToLoopInfo
                     (matcher,(pBVar6->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId);
  uVar13 = pLVar7->number + 1;
  pLVar7->number = uVar13;
  uVar1 = (pBVar6->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower;
  if (uVar1 <= uVar13) {
    uVar2 = (pBVar6->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.upper;
    if ((uVar2 != 0xffffffff) && (uVar2 <= uVar13)) {
      if (uVar1 < uVar2) {
        pCVar8 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Top
                           (&contStack->
                             super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
        if (pCVar8 == (Cont *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0xe3b,"(top != 0)","top != 0");
          if (!bVar5) goto LAB_00d4eab2;
          *puVar9 = 0;
        }
        if (pCVar8->tag != RewindLoopFixedGroupLastIteration) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0xe3c,"(top->tag == Cont::ContTag::RewindLoopFixedGroupLastIteration)"
                             ,"top->tag == Cont::ContTag::RewindLoopFixedGroupLastIteration");
          if (!bVar5) {
LAB_00d4eab2:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar9 = 0;
        }
        *(undefined1 *)&pCVar8[1]._vptr_Cont = 0;
      }
      pGVar10 = Matcher::GroupIdToGroupInfo(matcher,(pBVar6->super_GroupMixin).groupId);
      CVar3 = (pBVar6->super_FixedLengthMixin).length;
      pGVar10->offset = *inputOffset - CVar3;
      pGVar10->length = CVar3;
      LVar14 = (pBVar6->super_BeginLoopMixin).exitLabel;
      goto LAB_00d4ea51;
    }
    if (uVar13 == uVar1) {
      pcVar12 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
                Push<UnifiedRegex::RewindLoopFixedGroupLastIterationCont>
                          (&contStack->
                            super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
      LVar14 = (this->super_RepeatLoopMixin).beginLabel;
      pcVar12[8] = '\n';
      *(undefined ***)pcVar12 = &PTR_Print_013e0398;
      *(Label *)(pcVar12 + 0xc) = LVar14;
      pcVar12[0x10] = '\x01';
      Matcher::PushStats(matcher,contStack,input);
    }
  }
  LVar14 = (this->super_RepeatLoopMixin).beginLabel + 0x1c;
LAB_00d4ea51:
  puVar11 = Matcher::LabelToInstPointer(matcher,LVar14);
  *instPointer = puVar11;
  return false;
}

Assistant:

inline bool RepeatLoopFixedGroupLastIterationInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopFixedGroupLastIterationInst* begin = matcher.L2I(BeginLoopFixedGroupLastIteration, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        loopInfo->number++;

        if (loopInfo->number < begin->repeats.lower)
        {
            // Must match another iteration of body. Failure of body signals failure of the entire loop.
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedGroupLastIterationInst));
        }
        else if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
        {
            // Matched maximum number of iterations. Continue with follow.
            if (begin->repeats.lower < begin->repeats.upper)
            {
                // Failure of follow will try one fewer iterations (subject to repeats.lower).
                // Since loop body is non-deterministic and does not define groups the rewind continuation must be on top of the stack.
                Cont *top = contStack.Top();
                Assert(top != 0);
                Assert(top->tag == Cont::ContTag::RewindLoopFixedGroupLastIteration);
                RewindLoopFixedGroupLastIterationCont* rewind = (RewindLoopFixedGroupLastIterationCont*)top;
                rewind->tryingBody = false;
            }
            // else: we never pushed a rewind continuation

            // Bind group
            GroupInfo* groupInfo = matcher.GroupIdToGroupInfo(begin->groupId);
            groupInfo->offset = inputOffset - begin->length;
            groupInfo->length = begin->length;

            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        else
        {
            // CHOICEPOINT: Try one more iteration of body. Failure of body will rewind input to here and
            // try follow.
            if (loopInfo->number == begin->repeats.lower)
            {
                // i.e. begin->repeats.lower > 0, so continuation won't have been pushed in BeginLoopFixed
                PUSH(contStack, RewindLoopFixedGroupLastIterationCont, beginLabel, true);
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.PushStats(contStack, input);
#endif
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedGroupLastIterationInst));
        }
        return false;
    }